

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

int recff_bit64_nary(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  CTState *cts;
  CTypeID CVar2;
  TRef TVar3;
  TRef TVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  CType *d;
  uint k;
  
  cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  uVar7 = 0;
  k = 0;
  while( true ) {
    if (J->base[uVar7] == 0) break;
    CVar2 = crec_bit64_type(cts,rd->argv + uVar7);
    if (k <= CVar2) {
      k = CVar2;
    }
    uVar7 = uVar7 + 1;
  }
  if (k == 0) {
    iVar5 = 0;
  }
  else {
    d = cts->tab + k;
    uVar1 = rd->data;
    TVar3 = crec_ct_tv(J,d,0,*J->base,rd->argv);
    uVar6 = 1;
    while( true ) {
      if (J->base[uVar6] == 0) break;
      TVar4 = crec_ct_tv(J,d,0,J->base[uVar6],rd->argv + uVar6);
      (J->fold).ins.field_0.ot = (short)k + 10U | (ushort)(uVar1 << 8);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar3 = lj_opt_fold(J);
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    TVar4 = lj_ir_kint(J,k);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    TVar3 = lj_opt_fold(J);
    *J->base = TVar3;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int LJ_FASTCALL recff_bit64_nary(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = 0;
  MSize i;
  for (i = 0; J->base[i] != 0; i++) {
    CTypeID aid = crec_bit64_type(cts, &rd->argv[i]);
    if (id < aid) id = aid;  /* Determine highest type rank of all arguments. */
  }
  if (id) {
    CType *ct = ctype_get(cts, id);
    uint32_t ot = IRT(rd->data, id-CTID_INT64+IRT_I64);
    TRef tr = crec_ct_tv(J, ct, 0, J->base[0], &rd->argv[0]);
    for (i = 1; J->base[i] != 0; i++) {
      TRef tr2 = crec_ct_tv(J, ct, 0, J->base[i], &rd->argv[i]);
      tr = emitir(ot, tr, tr2);
    }
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}